

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::markAsDisconnected(CoreBroker *this,GlobalBrokerId brkid)

{
  bool bVar1;
  CoreBroker *pCVar2;
  BasicBrokerInfo *pBVar3;
  DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
  *pDVar4;
  BasicFedInfo *pBVar5;
  GlobalBrokerId in_ESI;
  undefined8 in_RDI;
  GlobalFederateId unaff_retaddr;
  BasicFedInfo *fed;
  size_t ii_1;
  BasicBrokerInfo *brk;
  size_t ii;
  size_t in_stack_ffffffffffffff98;
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  *in_stack_ffffffffffffffa0;
  DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
  *this_00;
  DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
  *local_38;
  CoreBroker *pCVar6;
  CoreBroker *this_01;
  undefined4 in_stack_fffffffffffffff8;
  
  pCVar6 = (CoreBroker *)0x0;
  while (this_01 = pCVar6,
        pCVar2 = (CoreBroker *)
                 gmlc::containers::
                 DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                 ::size((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                         *)0x60a28b), pCVar6 < pCVar2) {
    pBVar3 = gmlc::containers::
             DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
             ::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    bVar1 = GlobalBrokerId::operator==(&pBVar3->global_id,in_ESI);
    if ((bVar1) && (pBVar3->state != ERROR_STATE)) {
      pBVar3->state = DISCONNECTED;
    }
    bVar1 = GlobalBrokerId::operator==(&pBVar3->parent,in_ESI);
    if ((bVar1) && (pBVar3->state != ERROR_STATE)) {
      pBVar3->state = DISCONNECTED;
      markAsDisconnected(this_01,(GlobalBrokerId)(BaseType)((ulong)in_RDI >> 0x20));
    }
    pCVar6 = (CoreBroker *)((long)&(this_01->super_Broker)._vptr_Broker + 1);
  }
  local_38 = (DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
              *)0x0;
  while (this_00 = local_38,
        pDVar4 = (DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                  *)gmlc::containers::
                    DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                    ::size((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                            *)0x60a376), this_00 < pDVar4) {
    pBVar5 = gmlc::containers::
             DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
             ::operator[](this_00,in_stack_ffffffffffffff98);
    bVar1 = GlobalBrokerId::operator==(&pBVar5->parent,in_ESI);
    if (((bVar1) && (pBVar5->state != ERROR_STATE)) &&
       (pBVar5->state = DISCONNECTED, (pBVar5->reentrant & 1U) != 0)) {
      HandleManager::removeFederateHandles
                ((HandleManager *)CONCAT44(in_ESI.gid,in_stack_fffffffffffffff8),unaff_retaddr);
    }
    local_38 = (DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                *)((long)&(local_38->dataStorage).
                          super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  return;
}

Assistant:

void CoreBroker::markAsDisconnected(GlobalBrokerId brkid)
{
    // using regular loop here since dual mapped vector shouldn't produce a modifiable lvalue
    for (size_t ii = 0; ii < mBrokers.size(); ++ii) {  // NOLINT
        auto& brk = mBrokers[ii];
        if (brk.global_id == brkid) {
            if (brk.state != ConnectionState::ERROR_STATE) {
                brk.state = ConnectionState::DISCONNECTED;
            }
        }
        if (brk.parent == brkid) {
            if (brk.state != ConnectionState::ERROR_STATE) {
                brk.state = ConnectionState::DISCONNECTED;
                markAsDisconnected(brk.global_id);
            }
        }
    }
    for (size_t ii = 0; ii < mFederates.size(); ++ii) {  // NOLINT
        auto& fed = mFederates[ii];

        if (fed.parent == brkid) {
            if (fed.state != ConnectionState::ERROR_STATE) {
                fed.state = ConnectionState::DISCONNECTED;
                if (fed.reentrant) {
                    handles.removeFederateHandles(fed.global_id);
                }
            }
        }
    }
}